

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

xmlRMutexPtr xmlNewRMutex(void)

{
  xmlRMutexPtr tok;
  
  tok = (xmlRMutexPtr)malloc(0x68);
  if (tok != (xmlRMutexPtr)0x0) {
    xmlInitRMutex(tok);
  }
  return tok;
}

Assistant:

xmlRMutexPtr
xmlNewRMutex(void)
{
    xmlRMutexPtr tok;

    tok = malloc(sizeof(xmlRMutex));
    if (tok == NULL)
        return (NULL);
    xmlInitRMutex(tok);
    return (tok);
}